

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::WriteProjectHeader(cmLocalNinjaGenerator *this,ostream *os)

{
  ostream *poVar1;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar1 = std::operator<<(os,"# Project: ");
  poVar1 = std::operator<<(poVar1,(((this->super_cmLocalGenerator).Makefile)->ProjectName).
                                  _M_dataplus._M_p);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"# Configuration: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->ConfigName);
  std::endl<char,std::char_traits<char>>(poVar1);
  cmGlobalNinjaGenerator::WriteDivider(os);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProjectHeader(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os
    << "# Project: " << this->GetMakefile()->GetProjectName() << std::endl
    << "# Configuration: " << this->ConfigName << std::endl
    ;
  cmGlobalNinjaGenerator::WriteDivider(os);
}